

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O0

uint16_t __thiscall hrgls::API::GetVerbosity(API *this)

{
  API_private *pAVar1;
  mapped_type mVar2;
  mapped_type *pmVar3;
  key_type local_28;
  uint16_t local_1a;
  API *pAStack_18;
  uint16_t ret;
  API *this_local;
  
  local_1a = 0;
  if (this->m_private == (API_private *)0x0) {
    this_local._6_2_ = 0;
  }
  else {
    pAStack_18 = this;
    mVar2 = hrgls_APIGetVerbosity(this->m_private->m_api,&local_1a);
    pAVar1 = this->m_private;
    local_28._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar3 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pAVar1->m_status,&local_28);
    *pmVar3 = mVar2;
    this_local._6_2_ = local_1a;
  }
  return this_local._6_2_;
}

Assistant:

uint16_t API::GetVerbosity() const
  {
    uint16_t ret = 0;
    if (!m_private) {
      return ret;
    }

    m_private->m_status[std::this_thread::get_id()] = hrgls_APIGetVerbosity(m_private->m_api, &ret);
    return ret;
  }